

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTabs.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckTabs(Parser *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bool bVar1;
  size_t pos;
  bool bVar2;
  sregex_iterator currentTabIterator;
  sregex_iterator end;
  sregex lineWithTabRegex;
  Error error;
  
  this->m_TestsDone[10] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 10));
  boost::xpressive::
  basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::compile((char_type *)&lineWithTabRegex,0x16295a);
  begin._M_current = (this->m_Buffer)._M_dataplus._M_p;
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::regex_iterator(&currentTabIterator,begin,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(begin._M_current + (this->m_Buffer)._M_string_length),&lineWithTabRegex,
                   format_default);
  end.impl_.px = (intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )(regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0;
  bVar2 = true;
  while( true ) {
    bVar1 = boost::xpressive::operator!=(&currentTabIterator,&end);
    if (!bVar1) break;
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    pos = boost::xpressive::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)currentTabIterator.impl_.px + 0x10),1);
    error.line = GetLineNumber(this,pos,false);
    error.number = 10;
    error.line2 = error.line;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)&error.description);
    bVar2 = false;
    boost::xpressive::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&currentTabIterator);
  }
  boost::
  intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(&end.impl_);
  boost::
  intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr(&currentTabIterator.impl_);
  boost::
  intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~intrusive_ptr((intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&lineWithTabRegex);
  return bVar2;
}

Assistant:

bool Parser::CheckTabs()
{
  m_TestsDone[TABS] = true;
  m_TestsDescription[TABS] = "The file should not have any tabs";

  bool hasError = false;

  sregex lineWithTabRegex = sregex::compile(R"(^[^\r\n]*?(\t)[^\r\n]*$)");
  sregex_iterator currentTabIterator(m_Buffer.begin(), m_Buffer.end(), lineWithTabRegex);
  sregex_iterator end;

  for (; currentTabIterator != end; ++currentTabIterator)
    {
    Error error;
    smatch const &currentMatch = *currentTabIterator;
    error.line   = this->GetLineNumber(currentMatch.position(1), false); 
    error.line2  = error.line;
    error.number = TABS;
    error.description = "Tabs identified";
    m_ErrorList.push_back(error);    
    hasError = true;
    }

  return !hasError;
}